

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
          (QMovableArrayOps<QPersistentModelIndex> *this,qsizetype i,QPersistentModelIndex *args)

{
  qsizetype *pqVar1;
  QPersistentModelIndex **ppQVar2;
  Data *pDVar3;
  long lVar4;
  QPersistentModelIndex *pQVar5;
  QPersistentModelIndexData *pQVar6;
  QPersistentModelIndex QVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QPersistentModelIndex tmp;
  Inserter local_58;
  QPersistentModelIndex local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
           super_QArrayDataPointer<QPersistentModelIndex>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004fc829:
    local_30 = (QPersistentModelIndex)args->d;
    args->d = (QPersistentModelIndexData *)0x0;
    bVar8 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
            super_QArrayDataPointer<QPersistentModelIndex>.size != 0;
    QArrayDataPointer<QPersistentModelIndex>::detachAndGrow
              ((QArrayDataPointer<QPersistentModelIndex> *)this,(uint)(i == 0 && bVar8),1,
               (QPersistentModelIndex **)0x0,(QArrayDataPointer<QPersistentModelIndex> *)0x0);
    QVar7.d = local_30.d;
    if (i == 0 && bVar8) {
      pQVar5 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
               super_QArrayDataPointer<QPersistentModelIndex>.ptr;
      local_30.d = (QPersistentModelIndexData *)0x0;
      pQVar5[-1].d = QVar7.d;
      (this->super_QGenericArrayOps<QPersistentModelIndex>).
      super_QArrayDataPointer<QPersistentModelIndex>.ptr = pQVar5 + -1;
      pqVar1 = &(this->super_QGenericArrayOps<QPersistentModelIndex>).
                super_QArrayDataPointer<QPersistentModelIndex>.size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_58.displaceTo =
           (this->super_QGenericArrayOps<QPersistentModelIndex>).
           super_QArrayDataPointer<QPersistentModelIndex>.ptr;
      local_58.displaceFrom = local_58.displaceTo + i;
      local_58.displaceTo = local_58.displaceTo + i + 1;
      local_58.nInserts = 1;
      local_58.bytes =
           ((this->super_QGenericArrayOps<QPersistentModelIndex>).
            super_QArrayDataPointer<QPersistentModelIndex>.size - i) * 8;
      local_58.data = (QArrayDataPointer<QPersistentModelIndex> *)this;
      memmove(local_58.displaceTo,local_58.displaceFrom,local_58.bytes);
      QVar7.d = local_30.d;
      local_30.d = (QPersistentModelIndexData *)0x0;
      (local_58.displaceFrom)->d = QVar7.d;
      local_58.displaceFrom = local_58.displaceFrom + 1;
      Inserter::~Inserter(&local_58);
    }
    QPersistentModelIndex::~QPersistentModelIndex(&local_30);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
            super_QArrayDataPointer<QPersistentModelIndex>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QPersistentModelIndex>).
                      super_QArrayDataPointer<QPersistentModelIndex>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar4)) {
      pQVar5 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
               super_QArrayDataPointer<QPersistentModelIndex>.ptr;
      pQVar6 = args->d;
      args->d = (QPersistentModelIndexData *)0x0;
      pQVar5[lVar4].d = pQVar6;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QPersistentModelIndex *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QPersistentModelIndex>).
          super_QArrayDataPointer<QPersistentModelIndex>.ptr)) goto LAB_004fc829;
      pQVar5 = (this->super_QGenericArrayOps<QPersistentModelIndex>).
               super_QArrayDataPointer<QPersistentModelIndex>.ptr;
      pQVar6 = args->d;
      args->d = (QPersistentModelIndexData *)0x0;
      pQVar5[-1].d = pQVar6;
      ppQVar2 = &(this->super_QGenericArrayOps<QPersistentModelIndex>).
                 super_QArrayDataPointer<QPersistentModelIndex>.ptr;
      *ppQVar2 = *ppQVar2 + -1;
    }
    (this->super_QGenericArrayOps<QPersistentModelIndex>).
    super_QArrayDataPointer<QPersistentModelIndex>.size = lVar4 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }